

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O0

void QtPrivate::
     QPrivateSlotObject<void_(QToolButtonPrivate::*)(QAction_*),_QtPrivate::List<QAction_*>,_void>::
     impl(int which,QSlotObjectBase *this_,QObject *r,void **a,bool *ret)

{
  Function FVar1;
  Function *pFVar2;
  Function *in_RCX;
  void *in_RSI;
  undefined4 in_EDI;
  undefined8 in_R8;
  QPrivateSlotObject<void_(QToolButtonPrivate::*)(QAction_*),_QtPrivate::List<QAction_*>,_void>
  *that;
  void **in_stack_ffffffffffffff98;
  Function FVar3;
  QToolButtonPrivate *o;
  
  switch(in_EDI) {
  case 0:
    if (in_RSI != (void *)0x0) {
      ~QPrivateSlotObject((QPrivateSlotObject<void_(QToolButtonPrivate::*)(QAction_*),_QtPrivate::List<QAction_*>,_void>
                           *)0x70e97d);
      operator_delete(in_RSI,0x20);
    }
    break;
  case 1:
    pFVar2 = detail::StorageByValue<void_(QToolButtonPrivate::*)(QAction_*),_void>::object
                       ((StorageByValue<void_(QToolButtonPrivate::*)(QAction_*),_void> *)
                        ((long)in_RSI + 0x10));
    FVar3 = *pFVar2;
    o = (QToolButtonPrivate *)pFVar2[1];
    QObjectPrivate::get((QObject *)0x70e9ba);
    FunctionPointer<void(QToolButtonPrivate::*)(QAction*)>::call<QtPrivate::List<QAction*>,void>
              (FVar3,o,in_stack_ffffffffffffff98);
    break;
  case 2:
    FVar3 = *in_RCX;
    FVar1 = in_RCX[1];
    pFVar2 = detail::StorageByValue<void_(QToolButtonPrivate::*)(QAction_*),_void>::object
                       ((StorageByValue<void_(QToolButtonPrivate::*)(QAction_*),_void> *)
                        ((long)in_RSI + 0x10));
    *(bool *)in_R8 = FVar3 == *pFVar2 && (FVar3 == 0 || FVar1 == pFVar2[1]);
    break;
  case 3:
  }
  return;
}

Assistant:

static void impl(QSlotObjectBase *this_, QObject *r, void **a, int which, bool *ret)
#endif
    {
        const auto that = static_cast<QPrivateSlotObject*>(this_);
        switch (which) {
            case Destroy:
                delete that;
                break;
            case Call:
                FuncType::template call<Args, R>(that->object(),
                                                 static_cast<typename FuncType::Object *>(QObjectPrivate::get(r)), a);
                break;
            case Compare:
                *ret = *reinterpret_cast<Func *>(a) == that->object();
                break;
            case NumOperations: ;
        }
    }